

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelctemp.cpp
# Opt level: O0

void __thiscall
TPZIntelGen<pzshape::TPZShapeQuad>::Write
          (TPZIntelGen<pzshape::TPZShapeQuad> *this,TPZStream *buf,int withclassid)

{
  long *in_RSI;
  TPZManVector<int,_3> *in_RDI;
  int classid;
  TPZManVector<int,_3> order;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  TPZVec<int> *ord;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffb0;
  _func_int **in_stack_ffffffffffffffb8;
  TPZManVector<int,_3> *in_stack_ffffffffffffffc0;
  
  TPZInterpolatedElement::Write
            ((TPZInterpolatedElement *)in_RDI,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  ord = (TPZVec<int> *)&stack0xffffffffffffffb8;
  TPZManVector<int,_3>::TPZManVector
            (in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8,
             (int *)(ulong)in_stack_ffffffffffffffb0);
  TPZIntQuad::GetOrder
            ((TPZIntQuad *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),ord);
  TPZStream::Write<int>
            ((TPZStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),ord);
  (**(code **)(*in_RSI + 0x18))(in_RSI,(long)in_RDI->fExtAlloc + 8,1);
  (**(code **)(*(long *)&((TPZInterpolationSpace *)&in_RDI->super_TPZVec<int>)->super_TPZCompEl +
              0x20))();
  (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffa0,1);
  TPZManVector<int,_3>::~TPZManVector(in_RDI);
  return;
}

Assistant:

void TPZIntelGen<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
	TPZManVector<int,3> order(3,0);
	fIntRule.GetOrder(order);
	buf.Write(order);
	buf.Write(&fPreferredOrder,1);
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}